

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O2

string * __thiscall
HdlcAnalyzerResults::EscapeByteStr_abi_cxx11_
          (string *__return_storage_ptr__,HdlcAnalyzerResults *this,Frame *frame)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if ((this->mSettings->mTransmissionMode == HDLC_TRANSMISSION_BYTE_ASYNC) &&
     (((byte)frame[0x21] & 1) != 0)) {
    pcVar2 = "0x7D-";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "";
    paVar1 = &local_a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string HdlcAnalyzerResults::EscapeByteStr( const Frame& frame )
{
    if( ( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BYTE_ASYNC ) && ( frame.mFlags & HDLC_ESCAPED_BYTE ) )
    {
        return string( "0x7D-" );
    }
    else
    {
        return string( "" );
    }
}